

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O0

QRect __thiscall QMenuBarPrivate::menuRect(QMenuBarPrivate *this,bool extVisible)

{
  long lVar1;
  bool bVar2;
  QMenuBar *pQVar3;
  QStyle *pQVar4;
  QWidget *pQVar5;
  byte in_SIL;
  QMenuBarPrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar6;
  int hmargin;
  QMenuBar *q;
  QSize sz_1;
  QSize sz;
  QRect result;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = q_func(in_RDI);
  pQVar4 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x21,0,pQVar3);
  QVar6 = QWidget::rect((QWidget *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  QRect::adjust((QRect *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                in_stack_ffffffffffffff80);
  if ((in_SIL & 1) != 0) {
    bVar2 = QWidget::isRightToLeft((QWidget *)0x6591bf);
    if (bVar2) {
      QRect::left((QRect *)0x6591cf);
      (**(code **)(*(long *)&(in_RDI->extension->super_QToolButton).super_QAbstractButton.
                             super_QWidget + 0x70))();
      QSize::width((QSize *)0x6591f6);
      QRect::setLeft((QRect *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff7c);
    }
    else {
      QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      (**(code **)(*(long *)&(in_RDI->extension->super_QToolButton).super_QAbstractButton.
                             super_QWidget + 0x70))();
      QSize::width((QSize *)0x659239);
      QRect::setWidth((QRect *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      in_stack_ffffffffffffff7c);
    }
  }
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x65925c);
  if (bVar2) {
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x659276);
    bVar2 = QWidget::isVisible((QWidget *)0x65927e);
    if (bVar2) {
      pQVar5 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x6592a4);
      (**(code **)(*(long *)pQVar5 + 0x70))();
      bVar2 = QWidget::isRightToLeft((QWidget *)0x6592bc);
      if (bVar2) {
        QRect::right((QRect *)0x6592cc);
        QSize::width((QSize *)0x6592da);
        QRect::setRight((QRect *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff7c);
      }
      else {
        QRect::left((QRect *)0x6592f6);
        QSize::width((QSize *)0x659304);
        QRect::setLeft((QRect *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       in_stack_ffffffffffffff7c);
      }
    }
  }
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x659327);
  if (bVar2) {
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x659341);
    bVar2 = QWidget::isVisible((QWidget *)0x659349);
    if (bVar2) {
      pQVar5 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x65936f);
      (**(code **)(*(long *)pQVar5 + 0x70))();
      bVar2 = QWidget::isRightToLeft((QWidget *)0x659387);
      if (bVar2) {
        QRect::left((QRect *)0x659397);
        QSize::width((QSize *)0x6593a5);
        QRect::setLeft((QRect *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       in_stack_ffffffffffffff7c);
      }
      else {
        QRect::right((QRect *)0x6593c1);
        QSize::width((QSize *)0x6593cf);
        QRect::setRight((QRect *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff7c);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return QVar6;
}

Assistant:

QRect QMenuBarPrivate::menuRect(bool extVisible) const
{
    Q_Q(const QMenuBar);

    int hmargin = q->style()->pixelMetric(QStyle::PM_MenuBarPanelWidth, nullptr, q);
    QRect result = q->rect();
    result.adjust(hmargin, 0, -hmargin, 0);

    if (extVisible) {
        if (q->isRightToLeft())
            result.setLeft(result.left() + extension->sizeHint().width());
        else
            result.setWidth(result.width() - extension->sizeHint().width());
    }

    if (leftWidget && leftWidget->isVisible()) {
        QSize sz = leftWidget->sizeHint();
        if (q->isRightToLeft())
            result.setRight(result.right() - sz.width());
        else
            result.setLeft(result.left() + sz.width());
    }

    if (rightWidget && rightWidget->isVisible()) {
        QSize sz = rightWidget->sizeHint();
        if (q->isRightToLeft())
            result.setLeft(result.left() + sz.width());
        else
            result.setRight(result.right() - sz.width());
    }

    return result;
}